

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFactoryLoader_*>::relocate
          (QArrayDataPointer<QFactoryLoader_*> *this,qsizetype offset,QFactoryLoader ***data)

{
  bool bVar1;
  QFactoryLoader **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QFactoryLoader **res;
  
  first = (QFactoryLoader **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QFactoryLoader*,long_long>
            (first,in_RDI,(QFactoryLoader **)0x454dd7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QFactoryLoader*>,QFactoryLoader*const*>
                        (data,(QArrayDataPointer<QFactoryLoader_*> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QFactoryLoader ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }